

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void incomplete_block_test(void)

{
  void *pvVar1;
  fdb_doc *pfVar2;
  void *pvVar3;
  fdb_doc *doc;
  fdb_status fVar4;
  int iVar5;
  size_t keylen;
  size_t metalen;
  size_t bodylen;
  ulong uVar6;
  char *__format;
  long lVar7;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  fdb_doc *local_478;
  fdb_kvs_handle *local_470;
  fdb_doc *local_468 [2];
  fdb_file_handle *local_458;
  timeval local_450;
  fdb_kvs_config local_440;
  char local_428 [256];
  char local_328 [256];
  char local_228 [256];
  fdb_config local_128;
  
  gettimeofday(&local_450,(__timezone_ptr_t)0x0);
  memleak_start();
  local_478 = (fdb_doc *)0x0;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 0x400;
  local_128.flags = 1;
  local_128.compaction_threshold = '\0';
  fdb_open(&local_458,"./dummy1",&local_128);
  fdb_kvs_open_default(local_458,&local_470,&local_440);
  fVar4 = fdb_set_log_callback(local_470,logCallbackFunc,"incomplete_block_test");
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x904);
    incomplete_block_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x904,"void incomplete_block_test()");
  }
  uVar6 = 0;
  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 8) {
    sprintf(local_228,"key%d",uVar6);
    sprintf(local_328,"meta%d",uVar6);
    sprintf(local_428,"body%d",uVar6);
    keylen = strlen(local_228);
    metalen = strlen(local_328);
    bodylen = strlen(local_428);
    fdb_doc_create((fdb_doc **)((long)local_468 + lVar7),local_228,keylen,local_328,metalen,
                   local_428,bodylen);
    fdb_set(local_470,*(fdb_doc **)((long)local_468 + lVar7));
    uVar6 = (ulong)((int)uVar6 + 1);
  }
  lVar7 = 0;
  while( true ) {
    if (lVar7 == 2) {
      fdb_kvs_close(local_470);
      fdb_close(local_458);
      for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
        fdb_doc_free(local_468[lVar7]);
      }
      fdb_shutdown();
      memleak_end();
      __format = "%s PASSED\n";
      if (incomplete_block_test()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"incomplete block test");
      return;
    }
    fdb_doc_create(&local_478,local_468[lVar7]->key,local_468[lVar7]->keylen,(void *)0x0,0,
                   (void *)0x0,0);
    fVar4 = fdb_get(local_470,local_478);
    doc = local_478;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x917);
      incomplete_block_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x917,"void incomplete_block_test()");
    }
    pvVar1 = local_478->meta;
    pfVar2 = local_468[lVar7];
    pvVar3 = pfVar2->meta;
    iVar5 = bcmp(pvVar1,pvVar3,local_478->metalen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x918);
      incomplete_block_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x918,"void incomplete_block_test()");
    }
    pvVar1 = doc->body;
    pvVar3 = pfVar2->body;
    iVar5 = bcmp(pvVar1,pvVar3,doc->bodylen);
    if (iVar5 != 0) break;
    fdb_doc_free(doc);
    local_478 = (fdb_doc *)0x0;
    lVar7 = lVar7 + 1;
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0x919);
  incomplete_block_test()::__test_pass = 1;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x919,"void incomplete_block_test()");
}

Assistant:

void incomplete_block_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 2;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "incomplete_block_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // retrieve documents
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        // updated documents
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("incomplete block test");
}